

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spbcgs.c
# Opt level: O2

int SUNLinSolSolve_SPBCGS(SUNLinearSolver S,SUNMatrix A,N_Vector x,N_Vector b,realtype delta)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  N_Vector y;
  N_Vector z;
  N_Vector z_00;
  N_Vector z_01;
  N_Vector z_02;
  N_Vector z_03;
  N_Vector x_00;
  N_Vector y_00;
  undefined8 uVar4;
  undefined8 uVar5;
  code *pcVar6;
  code *pcVar7;
  N_Vector x_01;
  uint uVar8;
  int iVar9;
  void *pvVar10;
  int iVar11;
  int iVar12;
  realtype rVar13;
  realtype rVar14;
  realtype rVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  ulong uStack_160;
  double local_d8;
  N_Vector Xv [3];
  realtype local_78;
  double dStack_70;
  double local_68;
  realtype local_58;
  N_Vector local_50;
  double local_48;
  undefined8 uStack_40;
  
  if (S == (SUNLinearSolver)0x0) {
    uStack_160 = 0xffffffffffffffff;
    goto LAB_0011782c;
  }
  piVar3 = (int *)S->content;
  iVar1 = *piVar3;
  uVar2 = piVar3[1];
  y = *(N_Vector *)(piVar3 + 0x18);
  z = *(N_Vector *)(piVar3 + 0x16);
  z_00 = *(N_Vector *)(piVar3 + 0x1a);
  z_01 = *(N_Vector *)(piVar3 + 0x1c);
  local_50 = *(N_Vector *)(piVar3 + 0x1e);
  z_02 = *(N_Vector *)(piVar3 + 0x20);
  z_03 = *(N_Vector *)(piVar3 + 0x22);
  x_00 = *(N_Vector *)(piVar3 + 0x12);
  y_00 = *(N_Vector *)(piVar3 + 0x14);
  uVar4 = *(undefined8 *)(piVar3 + 10);
  uVar5 = *(undefined8 *)(piVar3 + 0x10);
  pcVar6 = *(code **)(piVar3 + 8);
  pcVar7 = *(code **)(piVar3 + 0xe);
  piVar3[2] = 0;
  rVar13 = N_VDotProd(x,x);
  if ((rVar13 != 0.0) || (NAN(rVar13))) {
    iVar9 = (*pcVar6)(uVar4,x,y);
    if (iVar9 == 0) {
      N_VLinearSum(1.0,b,-1.0,y,y);
      goto LAB_001171a1;
    }
LAB_0011720a:
    uStack_160 = (long)(iVar9 >> 0x1f) ^ 3;
LAB_00117214:
    pvVar10 = S->content;
LAB_0011721c:
    *(ulong *)((long)pvVar10 + 0x18) = uStack_160;
  }
  else {
    N_VScale(1.0,b,y);
LAB_001171a1:
    uVar8 = uVar2 | 2;
    if (uVar8 == 3) {
      iVar9 = (*pcVar7)(delta,uVar5,y,z);
      if (iVar9 != 0) {
LAB_001171e2:
        uStack_160 = (long)(iVar9 >> 0x1f) ^ 5;
        goto LAB_00117214;
      }
    }
    else {
      N_VScale(1.0,y,z);
    }
    if (x_00 == (N_Vector)0x0) {
      N_VScale(1.0,z,y);
    }
    else {
      N_VProd(x_00,z,y);
    }
    rVar13 = N_VDotProd(y,y);
    dVar16 = 0.0;
    if (0.0 < rVar13) {
      if (rVar13 < 0.0) {
        dVar16 = sqrt(rVar13);
      }
      else {
        dVar16 = SQRT(rVar13);
      }
    }
    *(double *)(piVar3 + 4) = dVar16;
    if (dVar16 <= delta) {
      pvVar10 = S->content;
LAB_001177ac:
      *(undefined8 *)((long)pvVar10 + 0x18) = 0;
      uStack_160 = 0;
    }
    else {
      N_VScale(1.0,y,z);
      N_VScale(1.0,y,z_00);
      uVar2 = uVar2 & 0xfffffffe;
      iVar12 = 0;
      local_d8 = dVar16;
      iVar11 = 0;
      if (0 < iVar1) {
        iVar11 = iVar1;
      }
      do {
        if (iVar11 == iVar12) {
          if (dVar16 <= local_d8) {
            *(undefined8 *)((long)S->content + 0x18) = 2;
            uStack_160 = 2;
            goto LAB_00117829;
          }
LAB_001177c0:
          if (y_00 != (N_Vector)0x0) {
            N_VDiv(x,y_00,x);
          }
          if (uVar2 == 2) {
            iVar9 = (*pcVar7)(delta,uVar5,x,z_03);
            if (iVar9 != 0) {
              uStack_160 = (long)(iVar9 >> 0x1f) ^ 5;
              pvVar10 = S->content;
              goto LAB_0011721c;
            }
            N_VScale(1.0,z_03,x);
          }
          pvVar10 = S->content;
          if (iVar12 < iVar1) goto LAB_001177ac;
          *(undefined8 *)((long)pvVar10 + 0x18) = 1;
          uStack_160 = 1;
          goto LAB_0011782c;
        }
        piVar3[2] = piVar3[2] + 1;
        if (y_00 == (N_Vector)0x0) {
          N_VScale(1.0,z_00,z_03);
        }
        else {
          N_VDiv(z_00,y_00,z_03);
        }
        if (uVar2 == 2) {
          N_VScale(1.0,z_03,z_02);
          iVar9 = (*pcVar7)(delta,uVar5,z_02,z_03,2);
          if (iVar9 != 0) goto LAB_001171e2;
        }
        iVar9 = (*pcVar6)(uVar4,z_03,z_02);
        if (iVar9 != 0) goto LAB_0011720a;
        if (uVar8 == 3) {
          iVar9 = (*pcVar7)(delta,uVar5,z_02,z_03,1);
          if (iVar9 != 0) goto LAB_001171e2;
        }
        else {
          N_VScale(1.0,z_02,z_03);
        }
        if (x_00 == (N_Vector)0x0) {
          N_VScale(1.0,z_03,z_02);
        }
        else {
          N_VProd(x_00,z_03,z_02);
        }
        rVar14 = N_VDotProd(z_02,y);
        dVar17 = rVar13 / rVar14;
        local_48 = -dVar17;
        uStack_40 = 0x8000000000000000;
        N_VLinearSum(1.0,z,local_48,z_02,z_01);
        if (y_00 == (N_Vector)0x0) {
          N_VScale(1.0,z_01,z_03);
        }
        else {
          N_VDiv(z_01,y_00,z_03);
        }
        x_01 = local_50;
        if (uVar2 == 2) {
          N_VScale(1.0,z_03,local_50);
          iVar9 = (*pcVar7)(delta,uVar5,x_01,z_03,2);
          if (iVar9 != 0) goto LAB_001171e2;
        }
        iVar9 = (*pcVar6)(uVar4,z_03,x_01);
        if (iVar9 != 0) goto LAB_0011720a;
        if (uVar8 == 3) {
          iVar9 = (*pcVar7)(delta,uVar5,x_01,z_03,1);
          if (iVar9 != 0) goto LAB_001171e2;
        }
        else {
          N_VScale(1.0,x_01,z_03);
        }
        if (x_00 == (N_Vector)0x0) {
          N_VScale(1.0,z_03,x_01);
        }
        else {
          N_VProd(x_00,z_03,x_01);
        }
        rVar14 = N_VDotProd(x_01,x_01);
        rVar15 = N_VDotProd(x_01,z_01);
        dVar18 = rVar15 / (double)(~-(ulong)(rVar14 == 0.0) & (ulong)rVar14 |
                                  -(ulong)(rVar14 == 0.0) & 0x3ff0000000000000);
        local_78 = 1.0;
        Xv[0] = x;
        Xv[1] = z_00;
        Xv[2] = z_01;
        dStack_70 = dVar17;
        local_68 = dVar18;
        iVar9 = N_VLinearCombination(3,&local_78,Xv,x);
        if (iVar9 != 0) break;
        N_VLinearSum(1.0,z_01,-dVar18,x_01,z);
        rVar14 = N_VDotProd(z,z);
        local_d8 = 0.0;
        if (0.0 < rVar14) {
          rVar14 = N_VDotProd(z,z);
          if (rVar14 < 0.0) {
            local_d8 = sqrt(rVar14);
          }
          else {
            local_d8 = SQRT(rVar14);
          }
        }
        *(double *)(piVar3 + 4) = local_d8;
        if (local_d8 <= delta) goto LAB_001177c0;
        local_58 = N_VDotProd(z,y);
        local_78 = (dVar17 / dVar18) * (local_58 / rVar13);
        dStack_70 = local_48 * (local_58 / rVar13);
        local_68 = 1.0;
        Xv[0] = z_00;
        Xv[1] = z_02;
        Xv[2] = z;
        iVar9 = N_VLinearCombination(3,&local_78,Xv,z_00);
        iVar12 = iVar12 + 1;
        rVar13 = local_58;
      } while (iVar9 == 0);
      uStack_160 = 0xfffffffffffffff6;
LAB_00117829:
      uStack_160 = uStack_160 & 0xffffffff;
    }
  }
LAB_0011782c:
  return (int)uStack_160;
}

Assistant:

int SUNLinSolSolve_SPBCGS(SUNLinearSolver S, SUNMatrix A, N_Vector x, 
                          N_Vector b, realtype delta)
{
  /* local data and shortcut variables */
  realtype alpha, beta, omega, omega_denom, beta_num, beta_denom, r_norm, rho;
  N_Vector r_star, r, p, q, u, Ap, vtemp;
  booleantype preOnLeft, preOnRight, scale_x, scale_b, converged;
  int l, l_max, ier;
  void *A_data, *P_data;
  N_Vector sx, sb;
  ATimesFn atimes;
  PSolveFn psolve;
  realtype *res_norm;
  int *nli;

  /* local variables for fused vector operations */
  realtype cv[3];
  N_Vector Xv[3];
  
  /* Make local shorcuts to solver variables. */
  if (S == NULL) return(SUNLS_MEM_NULL);
  l_max        = SPBCGS_CONTENT(S)->maxl;
  r_star       = SPBCGS_CONTENT(S)->r_star;
  r            = SPBCGS_CONTENT(S)->r;
  p            = SPBCGS_CONTENT(S)->p;
  q            = SPBCGS_CONTENT(S)->q;
  u            = SPBCGS_CONTENT(S)->u;
  Ap           = SPBCGS_CONTENT(S)->Ap;
  vtemp        = SPBCGS_CONTENT(S)->vtemp;
  sb           = SPBCGS_CONTENT(S)->s1;
  sx           = SPBCGS_CONTENT(S)->s2;
  A_data       = SPBCGS_CONTENT(S)->ATData;
  P_data       = SPBCGS_CONTENT(S)->PData;
  atimes       = SPBCGS_CONTENT(S)->ATimes;
  psolve       = SPBCGS_CONTENT(S)->Psolve;
  nli          = &(SPBCGS_CONTENT(S)->numiters);
  res_norm     = &(SPBCGS_CONTENT(S)->resnorm);

  /* Initialize counters and convergence flag */
  *nli = 0;
  converged = SUNFALSE;

  /* set booleantype flags for internal solver options */
  preOnLeft  = ( (PRETYPE(S) == PREC_LEFT) || 
                 (PRETYPE(S) == PREC_BOTH) );
  preOnRight = ( (PRETYPE(S) == PREC_RIGHT) || 
                 (PRETYPE(S) == PREC_BOTH) );
  scale_x = (sx != NULL);
  scale_b = (sb != NULL);

  /* Set r_star to initial (unscaled) residual r_0 = b - A*x_0 */

  if (N_VDotProd(x, x) == ZERO) N_VScale(ONE, b, r_star);
  else {
    ier = atimes(A_data, x, r_star);
    if (ier != 0) {
      LASTFLAG(S) = (ier < 0) ?
        SUNLS_ATIMES_FAIL_UNREC : SUNLS_ATIMES_FAIL_REC;
      return(LASTFLAG(S));
    }
    N_VLinearSum(ONE, b, -ONE, r_star, r_star);
  }

  /* Apply left preconditioner and b-scaling to r_star = r_0 */

  if (preOnLeft) {
    ier = psolve(P_data, r_star, r, delta, PREC_LEFT);
    if (ier != 0) {
      LASTFLAG(S) = (ier < 0) ?
        SUNLS_PSOLVE_FAIL_UNREC : SUNLS_PSOLVE_FAIL_REC;
      return(LASTFLAG(S));
    }
  }
  else N_VScale(ONE, r_star, r);

  if (scale_b) N_VProd(sb, r, r_star);
  else N_VScale(ONE, r, r_star);

  /* Initialize beta_denom to the dot product of r0 with r0 */

  beta_denom = N_VDotProd(r_star, r_star);

  /* Set r_norm to L2 norm of r_star = sb P1_inv r_0, and
     return if small */

  *res_norm = r_norm = rho = SUNRsqrt(beta_denom);
  if (r_norm <= delta) {
    LASTFLAG(S) = SUNLS_SUCCESS;
    return(LASTFLAG(S));
  }

  /* Copy r_star to r and p */

  N_VScale(ONE, r_star, r);
  N_VScale(ONE, r_star, p);

  /* Begin main iteration loop */

  for(l = 0; l < l_max; l++) {

    (*nli)++;

    /* Generate Ap = A-tilde p, where A-tilde = sb P1_inv A P2_inv sx_inv */

    /*   Apply x-scaling: vtemp = sx_inv p */

    if (scale_x) N_VDiv(p, sx, vtemp);
    else N_VScale(ONE, p, vtemp);

    /*   Apply right preconditioner: vtemp = P2_inv sx_inv p */

    if (preOnRight) {
      N_VScale(ONE, vtemp, Ap);
      ier = psolve(P_data, Ap, vtemp, delta, PREC_RIGHT);
      if (ier != 0) {
        LASTFLAG(S) = (ier < 0) ?
          SUNLS_PSOLVE_FAIL_UNREC : SUNLS_PSOLVE_FAIL_REC;
        return(LASTFLAG(S));
      }
    }

    /*   Apply A: Ap = A P2_inv sx_inv p */

    ier = atimes(A_data, vtemp, Ap );
    if (ier != 0) {
      LASTFLAG(S) = (ier < 0) ?
        SUNLS_ATIMES_FAIL_UNREC : SUNLS_ATIMES_FAIL_REC;
      return(LASTFLAG(S));
    }

    /*   Apply left preconditioner: vtemp = P1_inv A P2_inv sx_inv p */

    if (preOnLeft) {
      ier = psolve(P_data, Ap, vtemp, delta, PREC_LEFT);
      if (ier != 0) {
        LASTFLAG(S) = (ier < 0) ?
          SUNLS_PSOLVE_FAIL_UNREC : SUNLS_PSOLVE_FAIL_REC;
        return(LASTFLAG(S));
      }
    }
    else N_VScale(ONE, Ap, vtemp);

    /*   Apply b-scaling: Ap = sb P1_inv A P2_inv sx_inv p */

    if (scale_b) N_VProd(sb, vtemp, Ap);
    else N_VScale(ONE, vtemp, Ap);


    /* Calculate alpha = <r,r_star>/<Ap,r_star> */

    alpha = ((beta_denom / N_VDotProd(Ap, r_star)));

    /* Update q = r - alpha*Ap = r - alpha*(sb P1_inv A P2_inv sx_inv p) */

    N_VLinearSum(ONE, r, -alpha, Ap, q);

    /* Generate u = A-tilde q */

    /*   Apply x-scaling: vtemp = sx_inv q */

    if (scale_x) N_VDiv(q, sx, vtemp);
    else N_VScale(ONE, q, vtemp);

    /*   Apply right preconditioner: vtemp = P2_inv sx_inv q */

    if (preOnRight) {
      N_VScale(ONE, vtemp, u);
      ier = psolve(P_data, u, vtemp, delta, PREC_RIGHT);
      if (ier != 0) {
        LASTFLAG(S) = (ier < 0) ?
          SUNLS_PSOLVE_FAIL_UNREC : SUNLS_PSOLVE_FAIL_REC;
        return(LASTFLAG(S));
      }
    }

    /*   Apply A: u = A P2_inv sx_inv u */

    ier = atimes(A_data, vtemp, u );
    if (ier != 0) {
      LASTFLAG(S) = (ier < 0) ?
        SUNLS_ATIMES_FAIL_UNREC : SUNLS_ATIMES_FAIL_REC;
      return(LASTFLAG(S));
    }

    /*   Apply left preconditioner: vtemp = P1_inv A P2_inv sx_inv p */

    if (preOnLeft) {
      ier = psolve(P_data, u, vtemp, delta, PREC_LEFT);
      if (ier != 0) {
        LASTFLAG(S) = (ier < 0) ?
          SUNLS_PSOLVE_FAIL_UNREC : SUNLS_PSOLVE_FAIL_REC;
        return(LASTFLAG(S));
      }
    }
    else N_VScale(ONE, u, vtemp);

    /*   Apply b-scaling: u = sb P1_inv A P2_inv sx_inv u */

    if (scale_b) N_VProd(sb, vtemp, u);
    else N_VScale(ONE, vtemp, u);


    /* Calculate omega = <u,q>/<u,u> */

    omega_denom = N_VDotProd(u, u);
    if (omega_denom == ZERO) omega_denom = ONE;
    omega = (N_VDotProd(u, q) / omega_denom);

    /* Update x = x + alpha*p + omega*q */
    cv[0] = ONE;
    Xv[0] = x;

    cv[1] = alpha;
    Xv[1] = p;

    cv[2] = omega;
    Xv[2] = q;

    ier = N_VLinearCombination(3, cv, Xv, x);
    if (ier != SUNLS_SUCCESS) return(SUNLS_VECTOROP_ERR);

    /* Update the residual r = q - omega*u */

    N_VLinearSum(ONE, q, -omega, u, r);

    /* Set rho = norm(r) and check convergence */

    *res_norm = rho = SUNRsqrt(N_VDotProd(r, r));
    if (rho <= delta) {
      converged = SUNTRUE;
      break;
    }

    /* Not yet converged, continue iteration */
    /* Update beta = <rnew,r_star> / <rold,r_start> * alpha / omega */

    beta_num = N_VDotProd(r, r_star);
    beta = ((beta_num / beta_denom) * (alpha / omega));

    /* Update p = r + beta*(p - omega*Ap) = beta*p - beta*omega*Ap + r */
    cv[0] = beta;
    Xv[0] = p;

    cv[1] = -alpha*(beta_num / beta_denom);
    Xv[1] = Ap;

    cv[2] = ONE;
    Xv[2] = r;

    ier = N_VLinearCombination(3, cv, Xv, p);
    if (ier != SUNLS_SUCCESS) return(SUNLS_VECTOROP_ERR);

    /* udpate beta_denom for next iteration */
    beta_denom = beta_num;
  }

  /* Main loop finished */

  if ((converged == SUNTRUE) || (rho < r_norm)) {

    /* Apply the x-scaling and right preconditioner: x = P2_inv sx_inv x */

    if (scale_x) N_VDiv(x, sx, x);
    if (preOnRight) {
      ier = psolve(P_data, x, vtemp, delta, PREC_RIGHT);
      if (ier != 0) {
        LASTFLAG(S) = (ier < 0) ?
          SUNLS_PSOLVE_FAIL_UNREC : SUNLS_PSOLVE_FAIL_REC;
        return(LASTFLAG(S));
      }
      N_VScale(ONE, vtemp, x);
    }

    if (converged == SUNTRUE) 
      LASTFLAG(S) = SUNLS_SUCCESS;
    else 
      LASTFLAG(S) = SUNLS_RES_REDUCED;
    return(LASTFLAG(S));
    
  }
  else {
    LASTFLAG(S) = SUNLS_CONV_FAIL;
    return(LASTFLAG(S));
  }
}